

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O1

int PHYSFS_caseFold(PHYSFS_uint32 from,PHYSFS_uint32 *to)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ushort *puVar7;
  bool bVar8;
  bool bVar9;
  
  uVar4 = from;
  if (from < 0x80) {
    uVar4 = from | 0x20;
    if (0x19 < from - 0x41) {
      uVar4 = from;
    }
  }
  else {
    uVar3 = from >> 8 ^ from;
    if (from < 0x10000) {
      uVar6 = (ulong)((uVar3 & 0xff) << 4);
      if ((ulong)(&case_fold_hash1_16[0].count)[uVar6] != 0) {
        lVar1 = *(long *)((long)&case_fold_hash1_16[0].list + uVar6);
        uVar5 = 0;
        do {
          if (*(ushort *)(lVar1 + uVar5 * 4) == from) {
            *to = (uint)*(ushort *)(lVar1 + 2 + uVar5 * 4);
            iVar2 = 1;
            goto LAB_0010b9d6;
          }
          uVar5 = uVar5 + 1;
        } while ((&case_fold_hash1_16[0].count)[uVar6] != uVar5);
      }
      uVar6 = (ulong)((uVar3 & 0xf) << 4);
      uVar5 = (ulong)(&case_fold_hash2_16[0].count)[uVar6];
      bVar8 = uVar5 != 0;
      if (uVar5 == 0) {
        iVar2 = 1;
      }
      else {
        puVar7 = (ushort *)(*(long *)((long)&case_fold_hash2_16[0].list + uVar6) + 4);
        iVar2 = 1;
        uVar6 = 1;
        do {
          if (puVar7[-2] == from) {
            *to = (uint)puVar7[-1];
            to[1] = (uint)*puVar7;
            iVar2 = 2;
            break;
          }
          bVar8 = uVar6 < uVar5;
          puVar7 = puVar7 + 3;
          bVar9 = uVar6 != uVar5;
          uVar6 = uVar6 + 1;
        } while (bVar9);
      }
      if (bVar8) {
LAB_0010b9d6:
        bVar8 = false;
      }
      else {
        uVar6 = (ulong)((uVar3 & 3) << 4);
        uVar5 = (ulong)(&case_fold_hash3_16[0].count)[uVar6];
        bVar8 = uVar5 == 0;
        if (!bVar8) {
          lVar1 = *(long *)((long)&case_fold_hash3_16[0].list + uVar6);
          uVar6 = 0;
          do {
            if (*(ushort *)(lVar1 + uVar6 * 8) == from) {
              *to = (uint)*(ushort *)(lVar1 + 2 + uVar6 * 8);
              to[1] = (uint)*(ushort *)(lVar1 + 4 + uVar6 * 8);
              to[2] = (uint)*(ushort *)(lVar1 + 6 + uVar6 * 8);
              iVar2 = 3;
              goto LAB_0010b9d6;
            }
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
          bVar8 = uVar5 <= uVar6;
        }
      }
      if (!bVar8) {
        return iVar2;
      }
    }
    else {
      uVar6 = (ulong)((uVar3 & 0xf) << 4);
      if ((ulong)(&case_fold_hash1_32[0].count)[uVar6] != 0) {
        lVar1 = *(long *)((long)&case_fold_hash1_32[0].list + uVar6);
        uVar5 = 0;
        do {
          if (*(PHYSFS_uint32 *)(lVar1 + uVar5 * 8) == from) {
            uVar4 = *(uint *)(lVar1 + 4 + uVar5 * 8);
            break;
          }
          uVar5 = uVar5 + 1;
        } while ((&case_fold_hash1_32[0].count)[uVar6] != uVar5);
      }
    }
  }
  *to = uVar4;
  return 1;
}

Assistant:

int PHYSFS_caseFold(const PHYSFS_uint32 from, PHYSFS_uint32 *to)
{
    int i;

    if (from < 128)  /* low-ASCII, easy! */
    {
        if ((from >= 'A') && (from <= 'Z'))
            *to = from - ('A' - 'a');
        else
            *to = from;
        return 1;
    } /* if */

    else if (from <= 0xFFFF)
    {
        const PHYSFS_uint8 hash = ((from ^ (from >> 8)) & 0xFF);
        const PHYSFS_uint16 from16 = (PHYSFS_uint16) from;

        {
            const CaseFoldHashBucket1_16 *bucket = &case_fold_hash1_16[hash];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping1_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    *to = mapping->to0;
                    return 1;
                } /* if */
            } /* for */
        }

        {
            const CaseFoldHashBucket2_16 *bucket = &case_fold_hash2_16[hash & 15];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping2_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    to[0] = mapping->to0;
                    to[1] = mapping->to1;
                    return 2;
                } /* if */
            } /* for */
        }

        {
            const CaseFoldHashBucket3_16 *bucket = &case_fold_hash3_16[hash & 3];
            const int count = (int) bucket->count;
            for (i = 0; i < count; i++)
            {
                const CaseFoldMapping3_16 *mapping = &bucket->list[i];
                if (mapping->from == from16)
                {
                    to[0] = mapping->to0;
                    to[1] = mapping->to1;
                    to[2] = mapping->to2;
                    return 3;
                } /* if */
            } /* for */
        }
    } /* else if */

    else  /* codepoint that doesn't fit in 16 bits. */
    {
        const PHYSFS_uint8 hash = ((from ^ (from >> 8)) & 0xFF);
        const CaseFoldHashBucket1_32 *bucket = &case_fold_hash1_32[hash & 15];
        const int count = (int) bucket->count;
        for (i = 0; i < count; i++)
        {
            const CaseFoldMapping1_32 *mapping = &bucket->list[i];
            if (mapping->from == from)
            {
                *to = mapping->to0;
                return 1;
            } /* if */
        } /* for */
    } /* else */


    /* Not found...there's no remapping for this codepoint. */
    *to = from;
    return 1;
}